

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::SuggestFieldNumbers(google::protobuf::FileDescriptor*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  int *piVar7;
  stringstream id_list;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  poVar4 = std::operator<<(local_1a8,"Suggested field numbers for ");
  uVar5 = (ulong)*(ushort *)(*(long *)(**(long **)this + 0x10) + 2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)(~uVar5 + *(long *)(**(long **)this + 0x10)),uVar5);
  std::operator<<(poVar4,": ");
  piVar2 = (int *)(*(undefined8 **)(this + 8))[1];
  pcVar6 = "";
  for (piVar7 = (int *)**(undefined8 **)(this + 8); piVar7 != piVar2; piVar7 = piVar7 + 2) {
    iVar3 = **(int **)(this + 0x18);
    while( true ) {
      iVar1 = **(int **)(this + 0x10);
      if ((*piVar7 <= iVar1) || (iVar3 < 1)) break;
      poVar4 = std::operator<<(local_1a8,pcVar6);
      iVar3 = **(int **)(this + 0x10);
      **(int **)(this + 0x10) = iVar3 + 1;
      std::ostream::operator<<(poVar4,iVar3);
      iVar3 = **(int **)(this + 0x18) + -1;
      **(int **)(this + 0x18) = iVar3;
      pcVar6 = ", ";
    }
    if (iVar3 == 0) break;
    iVar3 = piVar7[1];
    if (piVar7[1] < iVar1) {
      iVar3 = iVar1;
    }
    **(int **)(this + 0x10) = iVar3;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}